

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarEnv.cpp
# Opt level: O1

void __thiscall VarEnv::display(VarEnv *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->vars)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name : ",7);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    (**(code **)(**(long **)(p_Var2 + 2) + 0x18))();
  }
  return;
}

Assistant:

void VarEnv::display() {
    for (auto &i: vars) {
        std::cout << "name : " << i.first << std::endl;
        i.second->display();
    }
}